

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void free_cdef_bufs(uint16_t **colbuf,uint16_t **srcbuf)

{
  undefined8 *in_RSI;
  long in_RDI;
  int plane;
  undefined4 local_14;
  
  aom_free(in_RSI);
  *in_RSI = 0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    aom_free(in_RSI);
    *(undefined8 *)(in_RDI + (long)local_14 * 8) = 0;
  }
  return;
}

Assistant:

static inline void free_cdef_bufs(uint16_t **colbuf, uint16_t **srcbuf) {
  aom_free(*srcbuf);
  *srcbuf = NULL;
  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    aom_free(colbuf[plane]);
    colbuf[plane] = NULL;
  }
}